

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O0

int64_t default_write_func(exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,
                          uint64_t offset,exr_stream_error_func_ptr_t error_cb)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  size_t in_RCX;
  void *in_RDX;
  int *in_RSI;
  undefined8 in_RDI;
  long in_R8;
  code *in_R9;
  uint64_t writesz;
  uint8_t *curbuf;
  int fd;
  _internal_exr_filehandle *fh;
  int64_t retsz;
  int64_t rv;
  size_t local_68;
  void *local_60;
  size_t local_48;
  long local_30;
  size_t local_8;
  
  if (in_RSI == (int *)0x0) {
    if (in_R9 != (code *)0x0) {
      (*in_R9)(in_RDI,3,"Invalid file handle pointer");
    }
    local_8 = 0xffffffffffffffff;
  }
  else {
    __fd = *in_RSI;
    if (__fd < 0) {
      if (in_R9 != (code *)0x0) {
        (*in_R9)(in_RDI,3,"Invalid file descriptor");
      }
      local_8 = 0xffffffffffffffff;
    }
    else {
      local_48 = 0;
      local_68 = in_RCX;
      local_60 = in_RDX;
      local_30 = in_R8;
      do {
        sVar1 = pwrite(__fd,local_60,local_68,local_30);
        if (sVar1 < 0) {
          piVar2 = __errno_location();
          if ((*piVar2 != 4) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
            local_48 = 0xffffffffffffffff;
            break;
          }
        }
        else {
          local_48 = sVar1 + local_48;
          local_60 = (void *)(sVar1 + (long)local_60);
          local_68 = local_68 - sVar1;
          local_30 = sVar1 + local_30;
        }
      } while ((long)local_48 < (long)in_RCX);
      if ((local_48 != in_RCX) && (in_R9 != (code *)0x0)) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        (*in_R9)(in_RDI,0xb,"Unable to write %lu bytes to stream, wrote %ld: %s",in_RCX,local_48,
                 pcVar3);
      }
      local_8 = local_48;
    }
  }
  return local_8;
}

Assistant:

static int64_t
default_write_func (
    exr_const_context_t         ctxt,
    void*                       userdata,
    const void*                 buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    int64_t                          rv, retsz = -1;
    struct _internal_exr_filehandle* fh      = userdata;
    int                              fd      = -1;
    const uint8_t*                   curbuf  = (const uint8_t*) buffer;
    uint64_t                         writesz = sz;

    if (sizeof (size_t) < sizeof (uint64_t))
    {
        if (sz >= (uint64_t) UINT32_MAX)
        {
            if (error_cb)
                error_cb (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "read request size too large for architecture");
            return retsz;
        }
    }

    if (!fh)
    {
        if (error_cb)
            error_cb (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file handle pointer");
        return retsz;
    }

    fd = fh->fd;
    if (fd < 0)
    {
        if (error_cb)
            error_cb (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file descriptor");
        return retsz;
    }

#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
    pthread_mutex_lock (&(fh->mutex));
#    endif
    {
#    if defined __USE_LARGEFILE64
        uint64_t spos = (uint64_t) lseek64 (fd, (off64_t) offset, SEEK_SET);
#    else
        uint64_t spos = (uint64_t) lseek (fd, (off_t) offset, SEEK_SET);
#    endif
        if (spos != offset)
        {
#    ifdef ILMTHREAD_THREADING_ENABLED
            pthread_mutex_unlock (&(fh->mutex));
#    endif
            if (error_cb)
            {
                if (spos == (uint64_t) -1)
                    error_cb (ctxt, EXR_ERR_WRITE_IO, strerror (errno));
                else
                    error_cb (
                        ctxt,
                        EXR_ERR_WRITE_IO,
                        "Unable to seek to requested position");
            }
            return retsz;
        }
    }
#endif

    retsz = 0;
    do
    {
#if CAN_USE_PREAD
        rv = pwrite (fd, curbuf, (size_t) writesz, (off_t) offset);
#else
        rv = write (fd, curbuf, (size_t) writesz);
#endif
        if (rv < 0)
        {
            if (errno == EINTR) continue;
            if (errno == EAGAIN) continue;
            retsz = -1;
            break;
        }
        retsz += rv;
        curbuf += rv;
        writesz -= (uint64_t) rv;
        offset += (uint64_t) rv;
    } while (retsz < (int64_t) sz);

#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
    pthread_mutex_unlock (&(fh->mutex));
#    endif
#endif
    if (retsz != (int64_t) sz && error_cb)
        error_cb (
            ctxt,
            EXR_ERR_WRITE_IO,
            "Unable to write %" PRIu64 " bytes to stream, wrote %" PRId64
            ": %s",
            sz,
            retsz,
            strerror (errno));
    return retsz;
}